

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

void __thiscall ui::Led::Led(Led *this,string *name)

{
  long lVar1;
  ConstStringListRef entries;
  Ref<ftxui::ButtonOption> option;
  Ref<ftxui::ButtonOption> option_00;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l_00;
  allocator_type local_282;
  allocator_type local_281;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_280;
  string *local_278;
  string *local_270;
  Component local_268;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_258;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_240;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_218;
  Container local_208 [16];
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_1f8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  ConstStringRef local_1c8;
  ConstStringRef local_1a0;
  ConstStringRef local_178;
  ConstStringRef local_150;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  Ref<ftxui::RadioboxOption> local_e8;
  
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ComponentBase).parent_ = (ComponentBase *)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ComponentBase).children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Led_00167580;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  local_270 = &this->name_;
  std::operator+(&this->file_path_,"/sys/class/leds/",name);
  this->brightness_ = 0;
  this->period_ = 0x14;
  this->ratio_ = 0.5;
  (this->trigger_)._M_dataplus._M_p = (pointer)&(this->trigger_).field_2;
  (this->trigger_)._M_string_length = 0;
  (this->trigger_).field_2._M_local_buf[0] = '\0';
  this->trigger_selected_ = 0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->trigger_entries_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = &this->trigger_entries_;
  local_278 = &this->file_path_;
  ftxui::Ref<ftxui::RadioboxOption>::Ref(&local_e8);
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)&this->trigger_entries_;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&this->trigger_list_;
  ftxui::Radiobox(entries,(int *)0x0,(Ref<ftxui::RadioboxOption> *)&this->trigger_selected_);
  ftxui::RadioboxOption::~RadioboxOption(&local_e8.owned_);
  ftxui::ConstStringRef::ConstStringRef(&local_150,"Toggle");
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:132:47)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:132:47)>
             ::_M_manager;
  option.address_ = (ButtonOption *)0x1;
  option._0_8_ = &local_108;
  local_108._M_unused._M_object = this;
  ftxui::Button((ConstStringRef *)&this->button_toggle_,(function<void_()> *)&local_150,option);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::__cxx11::string::~string((string *)&local_150);
  ftxui::ConstStringRef::ConstStringRef(&local_178,"Trigger on timer ");
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:134:35)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(),_ui::Led::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/beagleboard[P]beaglecfg/src/ui/panel/led/led_impl.cpp:134:35)>
              ::_M_manager;
  option_00.address_ = (ButtonOption *)0x1;
  option_00._0_8_ = &local_128;
  local_128._M_unused._M_object = this;
  ftxui::Button((ConstStringRef *)&this->button_trigger_timer_,(function<void_()> *)&local_178,
                option_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::__cxx11::string::~string((string *)&local_178);
  ftxui::ConstStringRef::ConstStringRef(&local_1a0,"Period      :");
  ftxui::Slider<int>((ConstStringRef *)&this->slider_period_,(int *)&local_1a0,(int)this + 0x6c,0,
                     2000);
  std::__cxx11::string::~string((string *)&local_1a0);
  ftxui::ConstStringRef::ConstStringRef(&local_1c8,"Ratio ON/OFF:");
  ftxui::Slider<float>((ConstStringRef *)&this->slider_delay,(float *)&local_1c8,0.0,1.0,0.05);
  std::__cxx11::string::~string((string *)&local_1c8);
  FetchState(this);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_228,
             &(this->trigger_list_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_218,
             &(this->button_toggle_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1f8,
             &(this->slider_period_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1e8,
             &(this->slider_delay).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_1d8,
             &(this->button_trigger_timer_).
              super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_1f8;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_258,__l,&local_281);
  ftxui::Container::Vertical(local_208,&local_258);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&local_228;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_240,__l_00,&local_282);
  ftxui::Container::Vertical((Container *)&local_268,&local_240);
  ftxui::ComponentBase::Add(&this->super_ComponentBase,&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_240);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_228._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_258);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_1f8._M_ptr + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

Led(std::string name) : name_(name), file_path_("/sys/class/leds/" + name) {
    FetchState();

    Add(Container::Vertical({
        trigger_list_,
        button_toggle_,
        Container::Vertical({
            slider_period_,
            slider_delay,
            button_trigger_timer_,
        }),
    }));
  }